

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_convolve_2d_sr_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  ushort uVar1;
  ushort uVar2;
  uint8_t uVar3;
  int iVar4;
  int16_t *piVar5;
  byte bVar6;
  byte bVar7;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  InterpFilterParams *in_stack_00000008;
  int16_t res;
  InterpFilterParams *in_stack_00000010;
  int k_1;
  int32_t sum_1;
  int x_1;
  int y_1;
  int offset_bits;
  int16_t *y_filter;
  int16_t *src_vert;
  int k;
  int32_t sum;
  int x;
  int y;
  int16_t *x_filter;
  uint8_t *src_horiz;
  int bits;
  int bd;
  int fo_horiz;
  int fo_vert;
  int im_stride;
  int im_h;
  int16_t im_block [17792];
  int local_8b84;
  int local_8b80;
  int local_8b7c;
  int local_8b78;
  int local_8b60;
  int local_8b5c;
  int local_8b58;
  int local_8b54;
  short local_8b28 [17794];
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  int local_c;
  
  uVar1 = in_stack_00000010->taps;
  iVar4 = in_stack_00000010->taps / 2 - 1;
  uVar2 = in_stack_00000008->taps;
  bVar6 = ('\x0e' - (char)*(undefined4 *)(y_filter + 10)) - (char)*(undefined4 *)(y_filter + 0xc);
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  piVar5 = av1_get_interp_filter_subpel_kernel(in_stack_00000008,sum_1 & 0xf);
  for (local_8b54 = 0; local_8b54 < (int)(in_R9D + (uint)uVar1 + -1); local_8b54 = local_8b54 + 1) {
    for (local_8b58 = 0; local_8b58 < local_20; local_8b58 = local_8b58 + 1) {
      local_8b5c = 0x4000;
      for (local_8b60 = 0; local_8b60 < (int)(uint)in_stack_00000008->taps;
          local_8b60 = local_8b60 + 1) {
        local_8b5c = (int)piVar5[local_8b60] *
                     (uint)*(byte *)((in_RDI - iVar4 * in_ESI) +
                                    (long)(int)(((local_8b54 * local_c + local_8b58) -
                                                (uVar2 / 2 - 1)) + local_8b60)) + local_8b5c;
      }
      local_8b28[local_8b54 * in_R8D + local_8b58] =
           (short)(local_8b5c + ((1 << ((byte)*(undefined4 *)(y_filter + 10) & 0x1f)) >> 1) >>
                  ((byte)*(undefined4 *)(y_filter + 10) & 0x1f));
    }
  }
  piVar5 = av1_get_interp_filter_subpel_kernel(in_stack_00000010,y_1 & 0xf);
  bVar7 = 0x16 - (char)*(undefined4 *)(y_filter + 10);
  for (local_8b78 = 0; local_8b78 < local_24; local_8b78 = local_8b78 + 1) {
    for (local_8b7c = 0; local_8b7c < local_20; local_8b7c = local_8b7c + 1) {
      local_8b80 = 1 << (bVar7 & 0x1f);
      for (local_8b84 = 0; local_8b84 < (int)(uint)in_stack_00000010->taps;
          local_8b84 = local_8b84 + 1) {
        local_8b80 = (int)piVar5[local_8b84] *
                     (int)local_8b28
                          [(long)(iVar4 * in_R8D) +
                           (long)(((local_8b78 - iVar4) + local_8b84) * in_R8D + local_8b7c)] +
                     local_8b80;
      }
      uVar3 = clip_pixel((int)(short)((short)(local_8b80 +
                                              ((1 << ((byte)*(undefined4 *)(y_filter + 0xc) & 0x1f))
                                              >> 1) >> ((byte)*(undefined4 *)(y_filter + 0xc) & 0x1f
                                                       )) -
                                     ((short)(1 << (bVar7 - (char)*(undefined4 *)(y_filter + 0xc) &
                                                   0x1f)) +
                                     (short)(1 << ((bVar7 - (char)*(undefined4 *)(y_filter + 0xc)) -
                                                   1 & 0x1f)))) + ((1 << (bVar6 & 0x1f)) >> 1) >>
                         (bVar6 & 0x1f));
      *(uint8_t *)(local_18 + (local_8b78 * local_1c + local_8b7c)) = uVar3;
    }
  }
  return;
}

Assistant:

void av1_convolve_2d_sr_c(const uint8_t *src, int src_stride, uint8_t *dst,
                          int dst_stride, int w, int h,
                          const InterpFilterParams *filter_params_x,
                          const InterpFilterParams *filter_params_y,
                          const int subpel_x_qn, const int subpel_y_qn,
                          ConvolveParams *conv_params) {
  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  assert(w <= MAX_SB_SIZE && h <= MAX_SB_SIZE);
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bd = 8;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;

  // horizontal filter
  const uint8_t *src_horiz = src - fo_vert * src_stride;
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_horiz[y * src_stride + x - fo_horiz + k];
      }

      // TODO(aomedia:3393): for 12-tap filter, in extreme cases, the result can
      // be beyond the following range. For better prediction, a clamping can be
      // added for 12 tap filter to ensure the horizontal filtering result is
      // within 16 bit. The same applies to the vertical filtering.
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_vert[(y - fo_vert + k) * im_stride + x];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      int16_t res = ROUND_POWER_OF_TWO(sum, conv_params->round_1) -
                    ((1 << (offset_bits - conv_params->round_1)) +
                     (1 << (offset_bits - conv_params->round_1 - 1)));
      dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(res, bits));
    }
  }
}